

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O3

void EPSG_calc_stereo(EPSG *psg,UINT32 samples,DEV_SMPL **out)

{
  short sVar1;
  DEV_SMPL *pDVar2;
  DEV_SMPL *pDVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  DEV_SMPL DVar11;
  ulong uVar12;
  
  pDVar2 = *out;
  pDVar3 = out[1];
  if (psg->quality == 0) {
    if (samples != 0) {
      uVar12 = 0;
      do {
        update_output(psg);
        lVar7 = 0x5b;
        iVar4 = 0;
        DVar11 = 0;
        iVar5 = 0;
        iVar9 = 0;
        do {
          bVar8 = psg->reg[lVar7 + -0xb];
          if (((~bVar8 & 3) == 0) && (psg->pcm3ch == '\0')) {
            iVar9 = (*(int *)((long)psg + lVar7 * 8 + -0x23c) *
                     (int)*(short *)(psg->reg + lVar7 * 2 + -0x10) >> 0x10) + iVar9;
            iVar5 = ((int)*(short *)(psg->reg + lVar7 * 2 + -0x10) *
                     *(int *)((long)psg + lVar7 * 8 + -0x238) >> 0x10) + iVar5;
            DVar11 = iVar9;
            iVar4 = iVar5;
          }
          else {
            if ((bVar8 & 1) != 0) {
              iVar9 = iVar9 + *(short *)(psg->reg + lVar7 * 2 + -0x10);
              DVar11 = iVar9;
            }
            if ((bVar8 & 2) != 0) {
              iVar5 = iVar5 + *(short *)(psg->reg + lVar7 * 2 + -0x10);
              iVar4 = iVar5;
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x5e);
        pDVar2[uVar12] = DVar11;
        pDVar3[uVar12] = iVar4;
        uVar12 = uVar12 + 1;
      } while (uVar12 != samples);
    }
  }
  else if (samples != 0) {
    uVar12 = 0;
    do {
      uVar10 = psg->realstep;
      uVar6 = psg->psgtime;
      iVar4 = psg->snext[0];
      if (uVar6 < uVar10) {
        iVar5 = psg->snext[1];
        do {
          psg->psgtime = uVar6 + psg->psgstep;
          psg->sprev[0] = iVar4;
          psg->sprev[1] = iVar5;
          update_output(psg);
          psg->snext[0] = 0;
          psg->snext[1] = 0;
          iVar5 = 0;
          lVar7 = 0x5b;
          iVar4 = 0;
          do {
            bVar8 = psg->reg[lVar7 + -0xb];
            if (((~bVar8 & 3) == 0) && (psg->pcm3ch == '\0')) {
              sVar1 = *(short *)(psg->reg + lVar7 * 2 + -0x10);
              iVar4 = iVar4 + (*(int *)((long)psg + lVar7 * 8 + -0x23c) * (int)sVar1 >> 0x10);
              psg->snext[0] = iVar4;
              iVar9 = (int)sVar1 * *(int *)((long)psg + lVar7 * 8 + -0x238) >> 0x10;
LAB_0015a64e:
              iVar5 = iVar5 + iVar9;
              psg->snext[1] = iVar5;
            }
            else {
              if ((bVar8 & 1) != 0) {
                iVar4 = iVar4 + *(short *)(psg->reg + lVar7 * 2 + -0x10);
                psg->snext[0] = iVar4;
                bVar8 = psg->reg[lVar7 + -0xb];
              }
              if ((bVar8 & 2) != 0) {
                iVar9 = (int)*(short *)(psg->reg + lVar7 * 2 + -0x10);
                goto LAB_0015a64e;
              }
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 != 0x5e);
          uVar10 = psg->realstep;
          uVar6 = psg->psgtime;
        } while (uVar6 < uVar10);
      }
      uVar6 = uVar6 - uVar10;
      psg->psgtime = uVar6;
      pDVar2[uVar12] =
           (int)(((double)uVar6 * (double)psg->sprev[0] +
                 (double)(psg->psgstep - uVar6) * (double)iVar4) / (double)psg->psgstep);
      pDVar3[uVar12] =
           (int)(((double)psg->psgtime * (double)psg->sprev[1] +
                 (double)(psg->psgstep - psg->psgtime) * (double)psg->snext[1]) /
                (double)psg->psgstep);
      uVar12 = uVar12 + 1;
    } while (uVar12 != samples);
  }
  return;
}

Assistant:

void
EPSG_calc_stereo (EPSG * psg, UINT32 samples, DEV_SMPL **out)
{
  DEV_SMPL *bufMO = out[0];
  DEV_SMPL *bufRO = out[1];
  int32_t buffers[2];
  UINT32 i;

  if (!psg->quality)
  {
    for (i = 0; i < samples; i ++)
    {
      update_output(psg);
      mix_output_stereo(psg, buffers);
      bufMO[i] = buffers[0];
      bufRO[i] = buffers[1];
    }
  }
  else
  {
    for (i = 0; i < samples; i ++)
    {
      while (psg->realstep > psg->psgtime)
      { 
        psg->psgtime += psg->psgstep;
        psg->sprev[0] = psg->snext[0];
        psg->sprev[1] = psg->snext[1];
        update_output(psg);
        mix_output_stereo(psg, psg->snext);
      }

      psg->psgtime -= psg->realstep;
      bufMO[i] = (DEV_SMPL) (((double) psg->snext[0] * (psg->psgstep - psg->psgtime)
                            + (double) psg->sprev[0] * psg->psgtime) / psg->psgstep);
      bufRO[i] = (DEV_SMPL) (((double) psg->snext[1] * (psg->psgstep - psg->psgtime)
                            + (double) psg->sprev[1] * psg->psgtime) / psg->psgstep);
    }
  }
}